

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O2

second_type
google::protobuf::
FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
          (unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
           *collection,first_type *key)

{
  iterator iVar1;
  second_type pMVar2;
  
  iVar1 = std::
          _Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&collection->_M_h,key);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    pMVar2 = (second_type)0x0;
  }
  else {
    pMVar2 = *(second_type *)
              ((long)iVar1.
                     super__Node_iterator_base<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>,_false>
                     ._M_cur + 0x10);
  }
  return pMVar2;
}

Assistant:

typename Collection::value_type::second_type
FindPtrOrNull(Collection& collection,  // NOLINT
              const typename Collection::value_type::first_type& key) {
  typename Collection::iterator it = collection.find(key);
  if (it == collection.end()) {
    return typename Collection::value_type::second_type();
  }
  return it->second;
}